

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

uint32_t helper_bcdcfz_ppc64(ppc_avr_t *r,ppc_avr_t *b,uint32_t ps)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong local_38;
  uint64_t uStack_30;
  
  bVar6 = 3;
  if (ps != 0) {
    bVar6 = 0xf;
  }
  local_38 = 0;
  uStack_30 = 0;
  bVar2 = b->u8[0];
  uVar5 = 0;
  do {
    bVar8 = bVar2;
    bVar7 = bVar6;
    if (uVar5 != 0) {
      bVar8 = b->u8[uVar5];
      bVar7 = bVar8 >> 4;
    }
    bVar3 = true;
    if ((bVar7 != bVar6) || (bVar8 = bVar8 & 0xf, 9 < bVar8)) break;
    uVar1 = uVar5 + 1;
    uVar9 = uVar1 >> 1 & 0x7fffffff;
    bVar7 = *(byte *)((long)&local_38 + uVar9);
    if ((uVar5 & 1) == 0) {
      bVar8 = bVar8 << 4 | bVar7 & 0xf;
    }
    else {
      bVar8 = bVar7 & 0xf0 | bVar8;
    }
    *(byte *)((long)&local_38 + uVar9) = bVar8;
    uVar5 = uVar1;
    bVar3 = bVar2 < 0xa0 && ps != 0;
  } while (uVar1 != 0x10);
  if (ps == 0) {
    bVar6 = (bVar2 & 0x40) == 0 ^ 0xd;
  }
  else {
    bVar6 = ((bVar2 >> 4) - 0xb & 0xfd) == 0 | 0xc;
  }
  bVar6 = (byte)local_38 & 0xf0 | bVar6;
  local_38 = CONCAT71(local_38._1_7_,bVar6);
  uVar5 = (ulong)bVar6;
  if ((uStack_30 == 0) && (uVar5 = local_38, local_38 < 0x10)) {
    uVar4 = 2;
  }
  else {
    bVar6 = ((byte)uVar5 & 0xf) - 10;
    if (bVar6 < 6) {
      uVar4 = *(uint32_t *)(&DAT_00db47d8 + (ulong)bVar6 * 4);
    }
    else {
      uVar4 = 8;
    }
  }
  if (bVar3) {
    uVar4 = 1;
  }
  r->u64[0] = local_38;
  r->u64[1] = uStack_30;
  return uVar4;
}

Assistant:

uint32_t helper_bcdcfz(ppc_avr_t *r, ppc_avr_t *b, uint32_t ps)
{
    int i;
    int cr = 0;
    int invalid = 0;
    int zone_digit = 0;
    int zone_lead = ps ? 0xF : 0x3;
    int digit = 0;
    ppc_avr_t ret = { .u64 = { 0, 0 } };
    int sgnb = b->VsrB(BCD_DIG_BYTE(0)) >> 4;

    if (unlikely((sgnb < 0xA) && ps)) {
        invalid = 1;
    }

    for (i = 0; i < 16; i++) {
        zone_digit = i ? b->VsrB(BCD_DIG_BYTE(i * 2)) >> 4 : zone_lead;
        digit = b->VsrB(BCD_DIG_BYTE(i * 2)) & 0xF;
        if (unlikely(zone_digit != zone_lead || digit > 0x9)) {
            invalid = 1;
            break;
        }

        bcd_put_digit(&ret, digit, i + 1);
    }

    if ((ps && (sgnb == 0xB || sgnb == 0xD)) ||
            (!ps && (sgnb & 0x4))) {
        bcd_put_digit(&ret, BCD_NEG_PREF, 0);
    } else {
        bcd_put_digit(&ret, BCD_PLUS_PREF_1, 0);
    }

    cr = bcd_cmp_zero(&ret);

    if (unlikely(invalid)) {
        cr = CRF_SO;
    }

    *r = ret;

    return cr;
}